

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O0

string * __thiscall fasttext::Args::modelToString_abi_cxx11_(Args *this,model_name mn)

{
  int in_EDX;
  string *in_RDI;
  undefined4 in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  allocator<char> local_15 [21];
  
  if (in_EDX == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
               (allocator<char> *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0));
    std::allocator<char>::~allocator(local_15);
  }
  else if (in_EDX == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
               (allocator<char> *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0));
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffdb);
  }
  else if (in_EDX == 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
               (allocator<char> *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0));
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffda);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
               (allocator<char> *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0));
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd9);
  }
  return in_RDI;
}

Assistant:

std::string Args::modelToString(model_name mn) const {
  switch (mn) {
    case model_name::cbow:
      return "cbow";
    case model_name::sg:
      return "sg";
    case model_name::sup:
      return "sup";
  }
  return "Unknown model name!"; // should never happen
}